

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  if ((this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
      super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
      super__Optional_payload_base<cmUVJobServerClient>._M_engaged == true) {
    cmUVJobServerClient::RequestToken((cmUVJobServerClient *)&this->JobServerClient);
    p_Var2 = (_List_node_base *)operator_new(0x18);
    *(int *)&p_Var2[1]._M_next = test;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->JobServerQueuedTests).super__List_base<int,_std::allocator<int>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
  StartTestProcess(this,test);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartTest(int test)
{
  if (this->JobServerClient) {
    // There is a job server.  Request a token and queue the test to run
    // when a token is received.  Note that if we do not get a token right
    // away it's possible that the system load will be higher when the
    // token is received and we may violate the test-load limit.  However,
    // this is unlikely because if we do not get a token right away, some
    // other job that's currently running must finish before we get one.
    this->JobServerClient->RequestToken();
    this->JobServerQueuedTests.emplace_back(test);
  } else {
    // There is no job server.  Start the test now.
    this->StartTestProcess(test);
  }
}